

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5ExprPhrase *
sqlite3Fts5ParseTerm(Fts5Parse *pParse,Fts5ExprPhrase *pAppend,Fts5Token *pToken,int bPrefix)

{
  Fts5Config *pFVar1;
  int iVar2;
  int iVar3;
  byte *z;
  size_t sVar4;
  Fts5ExprPhrase **ppFVar5;
  TokenCtx sCtx;
  int rc;
  Fts5ExprPhrase *local_48;
  undefined8 uStack_40;
  int local_34;
  
  pFVar1 = pParse->pConfig;
  uStack_40 = 0;
  local_34 = 0;
  local_48 = pAppend;
  z = (byte *)sqlite3Fts5Strndup(&local_34,pToken->p,pToken->n);
  iVar2 = local_34;
  if (local_34 == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    sVar4 = strlen((char *)z);
    iVar2 = (*pFVar1->pTokApi->xTokenize)
                      (pFVar1->pTok,&local_48,SUB14(bPrefix != 0,0) * 2 + 1,(char *)z,(int)sVar4,
                       fts5ParseTokenize);
  }
  sqlite3_free(z);
  if ((iVar2 == 0) && (iVar2 = (int)uStack_40, (int)uStack_40 == 0)) {
    if (pAppend == (Fts5ExprPhrase *)0x0) {
      iVar2 = pParse->nPhrase;
      if (((long)iVar2 & 7U) == 0) {
        ppFVar5 = pParse->apPhrase;
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          ppFVar5 = (Fts5ExprPhrase **)sqlite3Realloc(ppFVar5,(long)iVar2 * 8 + 0x40);
        }
        else {
          ppFVar5 = (Fts5ExprPhrase **)0x0;
        }
        if (ppFVar5 == (Fts5ExprPhrase **)0x0) {
          pParse->rc = 7;
          fts5ExprPhraseFree(local_48);
          return (Fts5ExprPhrase *)0x0;
        }
        pParse->apPhrase = ppFVar5;
      }
      pParse->nPhrase = pParse->nPhrase + 1;
    }
    if (local_48 == (Fts5ExprPhrase *)0x0) {
      local_48 = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(&pParse->rc,0x40);
    }
    else if ((long)local_48->nTerm != 0) {
      local_48->aTerm[(long)local_48->nTerm + -1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[(long)pParse->nPhrase + -1] = local_48;
  }
  else {
    pParse->rc = iVar2;
    fts5ExprPhraseFree(local_48);
    local_48 = (Fts5ExprPhrase *)0x0;
  }
  return local_48;
}

Assistant:

static Fts5ExprPhrase *sqlite3Fts5ParseTerm(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprPhrase *pAppend,        /* Phrase to append to */
  Fts5Token *pToken,              /* String to tokenize */
  int bPrefix                     /* True if there is a trailing "*" */
){
  Fts5Config *pConfig = pParse->pConfig;
  TokenCtx sCtx;                  /* Context object passed to callback */
  int rc;                         /* Tokenize return code */
  char *z = 0;

  memset(&sCtx, 0, sizeof(TokenCtx));
  sCtx.pPhrase = pAppend;

  rc = fts5ParseStringFromToken(pToken, &z);
  if( rc==SQLITE_OK ){
    int flags = FTS5_TOKENIZE_QUERY | (bPrefix ? FTS5_TOKENIZE_PREFIX : 0);
    int n;
    sqlite3Fts5Dequote(z);
    n = (int)strlen(z);
    rc = sqlite3Fts5Tokenize(pConfig, flags, z, n, &sCtx, fts5ParseTokenize);
  }
  sqlite3_free(z);
  if( rc || (rc = sCtx.rc) ){
    pParse->rc = rc;
    fts5ExprPhraseFree(sCtx.pPhrase);
    sCtx.pPhrase = 0;
  }else{

    if( pAppend==0 ){
      if( (pParse->nPhrase % 8)==0 ){
        sqlite3_int64 nByte = sizeof(Fts5ExprPhrase*) * (pParse->nPhrase + 8);
        Fts5ExprPhrase **apNew;
        apNew = (Fts5ExprPhrase**)sqlite3_realloc64(pParse->apPhrase, nByte);
        if( apNew==0 ){
          pParse->rc = SQLITE_NOMEM;
          fts5ExprPhraseFree(sCtx.pPhrase);
          return 0;
        }
        pParse->apPhrase = apNew;
      }
      pParse->nPhrase++;
    }

    if( sCtx.pPhrase==0 ){
      /* This happens when parsing a token or quoted phrase that contains
      ** no token characters at all. (e.g ... MATCH '""'). */
      sCtx.pPhrase = sqlite3Fts5MallocZero(&pParse->rc, sizeof(Fts5ExprPhrase));
    }else if( sCtx.pPhrase->nTerm ){
      sCtx.pPhrase->aTerm[sCtx.pPhrase->nTerm-1].bPrefix = (u8)bPrefix;
    }
    pParse->apPhrase[pParse->nPhrase-1] = sCtx.pPhrase;
  }

  return sCtx.pPhrase;
}